

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.cpp
# Opt level: O1

bool Diligent::VerifyCopyBLASAttribs(IRenderDevice *pDevice,CopyBLASAttribs *Attribs)

{
  char (*Args_1) [20];
  char (*Args_2) [18];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  char (*in_RCX) [73];
  char (*Args_1_00) [74];
  bool bVar8;
  char (*Args_5) [3];
  char (*Args_7) [34];
  char (*pacVar9) [30];
  char (*in_stack_ffffffffffffff68) [25];
  string msg;
  uint local_6c;
  char *local_68;
  char *local_60;
  long local_58;
  char (*local_50) [74];
  char (*local_48) [26];
  CopyBLASAttribs *local_40;
  long local_38;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  
  if (Attribs->pSrc == (IBottomLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pSrc must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [73])0x396;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x396);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->pDst == (IBottomLevelAS *)0x0) {
    FormatString<char[32],char[23]>
              (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
               (char (*) [32])"pDst must not be null.",(char (*) [23])in_RCX);
    in_RCX = (char (*) [73])0x397;
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
               ,0x397);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  if (Attribs->Mode == COPY_AS_MODE_COMPACT) {
    iVar2 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    iVar4 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar2) + 0x24) & 2) == 0) {
      FormatString<char[32],char[73]>
                (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                 (char (*) [32])
                 "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.",in_RCX);
      in_RCX = (char (*) [73])0x3db;
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3db);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
    if (*(long *)(CONCAT44(extraout_var_03,iVar4) + 0x28) == 0) {
      FormatString<char[32],char[56]>
                (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                 (char (*) [32])"pDst must have been create with non-zero CompactedSize.",
                 (char (*) [56])in_RCX);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                 ,0x3dc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    if (Attribs->Mode != COPY_AS_MODE_CLONE) {
      FormatString<char[40]>(&msg,(char (*) [40])"IDeviceContext::CopyBLAS: unknown Mode.");
      if (DebugMessageCallback != (undefined *)0x0) {
        (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      return false;
    }
    iVar2 = (*(pDevice->super_IObject)._vptr_IObject[0x18])(pDevice);
    if (*(int *)CONCAT44(extraout_var,iVar2) == 5) {
      iVar2 = (*(Attribs->pSrc->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      lVar5 = CONCAT44(extraout_var_00,iVar2);
      Args_5 = (char (*) [3])0x68f8be;
      iVar2 = (*(Attribs->pDst->super_IDeviceObject).super_IObject._vptr_IObject[4])();
      lVar6 = CONCAT44(extraout_var_01,iVar2);
      local_48 = (char (*) [26])(lVar5 + 0x10);
      local_58 = lVar5;
      if (*(int *)(lVar5 + 0x10) != *(int *)(lVar6 + 0x10)) {
        FormatString<char[32],char[26],unsigned_int,char[49],unsigned_int,char[3]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS triangle count (",local_48,
                   (uint *)") must be equal to the dst BLAS triangle count (",
                   (char (*) [49])(lVar6 + 0x10),(uint *)0x930cd5,Args_5);
        Args_5 = (char (*) [3])0x68f930;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          Args_5 = (char (*) [3])0x68f94b;
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      Args_1_00 = (char (*) [74])(local_58 + 0x20);
      local_50 = Args_1_00;
      if (*(int *)(local_58 + 0x20) != *(int *)(lVar6 + 0x20)) {
        FormatString<char[32],char[21],unsigned_int,char[44],unsigned_int,char[3]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])"Src BLAS box count (",(char (*) [21])Args_1_00,
                   (uint *)") must be equal to the dst BLAS box count (",
                   (char (*) [44])(lVar6 + 0x20),(uint *)0x930cd5,Args_5);
        Args_1_00 = (char (*) [74])0x3a4;
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      if (*(char *)(local_58 + 0x24) != *(char *)(lVar6 + 0x24)) {
        FormatString<char[32],char[74]>
                  (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                   (char (*) [32])
                   "Source and destination BLASes must have been created with the same flags.",
                   Args_1_00);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                   ,0x3a7);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
      }
      local_6c = 0;
      local_40 = Attribs;
      if (*(int *)*local_48 != 0) {
        paVar1 = &msg.field_2;
        local_38 = lVar6;
        do {
          Args_1 = (char (*) [20])(*(long *)(local_58 + 8) + (ulong)local_6c * 0x18);
          Args_7 = (char (*) [34])0x68fa8d;
          uVar3 = (*(local_40->pDst->super_IDeviceObject).super_IObject._vptr_IObject[8])
                            (local_40->pDst,*(undefined8 *)*Args_1);
          if (uVar3 == 0xffffffff) {
            FormatString<char[32],char[20],char_const*,char[13],unsigned_int,char[23]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",
                       (char (*) [32])"Src GeometryName (\'",Args_1,(char **)"\') at index ",
                       (char (*) [13])&local_6c,(uint *)0x919567,(char (*) [23])Args_7);
            Args_7 = (char (*) [34])0x68fae2;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3ae);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68faf9;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          lVar5 = *(long *)(lVar6 + 8);
          uVar7 = (ulong)uVar3;
          if (*(int *)(*Args_1 + 8) != *(int *)(lVar5 + 8 + uVar7 * 0x18)) {
            FormatString<char[32],char[23],unsigned_int,char[43],unsigned_int,char[39],unsigned_int,char[34]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x9193fb,
                       (char (*) [23])(*Args_1 + 8),
                       (uint *)") in source triangle description at index ",(char (*) [43])&local_6c
                       ,(uint *)" does not match MaxVertexCount value (",
                       (char (*) [39])(lVar5 + uVar7 * 0x18 + 8),
                       (uint *)") in the destination description.",Args_7);
            Args_7 = (char (*) [34])0x68fb6f;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b3);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68fb86;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          lVar6 = local_38;
          lVar5 = lVar5 + uVar7 * 0x18;
          if ((*Args_1)[0xc] != *(char *)(lVar5 + 0xc)) {
            local_68 = GetValueTypeString((*Args_1)[0xc]);
            pacVar9 = (char (*) [30])0x68fbb2;
            local_60 = GetValueTypeString(*(VALUE_TYPE *)(lVar5 + 0xc));
            FormatString<char[32],char[24],char_const*,char[43],unsigned_int,char[40],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x919444,
                       (char (*) [24])&local_68,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_6c,(uint *)" does not match VertexValueType value (",
                       (char (*) [40])&local_60,(char **)") in destination description.",pacVar9);
            Args_7 = (char (*) [34])0x68fc15;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68fc2c;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if ((*Args_1)[0xd] != *(char *)(lVar5 + 0xd)) {
            local_68 = (char *)CONCAT44(local_68._4_4_,(uint)(byte)(*Args_1)[0xd]);
            local_60 = (char *)CONCAT44(local_60._4_4_,(uint)*(byte *)(lVar5 + 0xd));
            FormatString<char[32],char[29],unsigned_int,char[43],unsigned_int,char[45],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x91948a,
                       (char (*) [29])&local_68,(uint *)") in source triangle description at index "
                       ,(char (*) [43])&local_6c,
                       (uint *)" does not match VertexComponentCount value (",
                       (char (*) [45])&local_60,(uint *)") in destination description.",
                       (char (*) [30])Args_7);
            Args_7 = (char (*) [34])0x68fca6;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3b9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68fcbd;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (*(int *)(*Args_1 + 0x10) != *(int *)(lVar5 + 0x10)) {
            FormatString<char[32],char[26],unsigned_int,char[43],unsigned_int,char[42],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x9194b7,
                       (char (*) [26])(*Args_1 + 0x10),
                       (uint *)") in source triangle description at index ",(char (*) [43])&local_6c
                       ,(uint *)" does not match MaxPrimitiveCount value (",
                       (char (*) [42])(lVar5 + 0x10),(uint *)") in destination description.",
                       (char (*) [30])Args_7);
            Args_7 = (char (*) [34])0x68fd22;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3bc);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68fd39;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (Args_1[1][0] != *(char *)(lVar5 + 0x14)) {
            local_68 = GetValueTypeString(Args_1[1][0]);
            pacVar9 = (char (*) [30])0x68fd5c;
            local_60 = GetValueTypeString(*(VALUE_TYPE *)(lVar5 + 0x14));
            FormatString<char[32],char[18],char_const*,char[43],unsigned_int,char[34],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x9194e1,
                       (char (*) [18])&local_68,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_6c,(uint *)" does not match IndexType value (",
                       (char (*) [34])&local_60,(char **)") in destination description.",pacVar9);
            Args_7 = (char (*) [34])0x68fdbf;
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3bf);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              Args_7 = (char (*) [34])0x68fdd6;
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          if (Args_1[1][1] != *(char *)(lVar5 + 0x15)) {
            local_68 = "false";
            if (Args_1[1][1] != '\0') {
              local_68 = "true";
            }
            local_60 = "false";
            if (*(char *)(lVar5 + 0x15) != '\0') {
              local_60 = "true";
            }
            FormatString<char[32],char[25],char_const*,char[43],unsigned_int,char[41],char_const*,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x919503,
                       (char (*) [25])&local_68,
                       (char **)") in source triangle description at index ",
                       (char (*) [43])&local_6c,(uint *)" does not match AllowsTransforms value (",
                       (char (*) [41])&local_60,(char **)") in destination description.",
                       (char (*) [30])Args_7);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3c2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != paVar1) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          local_6c = local_6c + 1;
        } while (local_6c < *(uint *)*local_48);
      }
      local_68 = (char *)((ulong)local_68 & 0xffffffff00000000);
      bVar8 = *(int *)*local_50 != 0;
      if (bVar8) {
        uVar3 = 0;
        do {
          Args_2 = (char (*) [18])(*(long *)(local_58 + 0x18) + (ulong)uVar3 * 0x10);
          pacVar9 = (char (*) [30])0x68fee8;
          uVar3 = (*(local_40->pDst->super_IDeviceObject).super_IObject._vptr_IObject[8])
                            (local_40->pDst,
                             *(undefined8 *)(*(long *)(local_58 + 0x18) + (ulong)uVar3 * 0x10));
          if (uVar3 == 0xffffffff) {
            FormatString<char[55],unsigned_int,char[18],char_const*,char[25]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[",
                       (char (*) [55])&local_68,(uint *)"].GeometryName (\'",Args_2,
                       (char **)"\') is not found in pDst.",in_stack_ffffffffffffff68);
            if (DebugMessageCallback != (undefined *)0x0) {
              (*(code *)DebugMessageCallback)(2,msg._M_dataplus._M_p,0,0,0);
            }
LAB_0068ffb3:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)msg._M_dataplus._M_p != &msg.field_2) {
              operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
            }
          }
          else if (*(int *)(*Args_2 + 8) !=
                   *(int *)(*(long *)(lVar6 + 0x18) + 8 + (ulong)uVar3 * 0x10)) {
            FormatString<char[32],char[20],unsigned_int,char[38],unsigned_int,char[36],unsigned_int,char[30]>
                      (&msg,(Diligent *)"Copy BLAS attribs are invalid: ",(char (*) [32])0x9195b4,
                       (char (*) [20])(*Args_2 + 8),(uint *)") in source box description at index ",
                       (char (*) [38])&local_68,(uint *)" does not match MaxBoxCount value (",
                       (char (*) [36])(*(long *)(lVar6 + 0x18) + (ulong)uVar3 * 0x10 + 8),
                       (uint *)") in destination description.",pacVar9);
            DebugAssertionFailed
                      (msg._M_dataplus._M_p,"VerifyCopyBLASAttribs",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DeviceContextBase.cpp"
                       ,0x3d2);
            goto LAB_0068ffb3;
          }
          if (uVar3 == 0xffffffff) {
            if (!bVar8) {
              return true;
            }
            return false;
          }
          uVar3 = (int)local_68 + 1;
          local_68 = (char *)CONCAT44(local_68._4_4_,uVar3);
          bVar8 = uVar3 < *(uint *)*local_50;
        } while (bVar8);
      }
    }
  }
  return true;
}

Assistant:

bool VerifyCopyBLASAttribs(const IRenderDevice* pDevice, const CopyBLASAttribs& Attribs)
{
#define CHECK_COPY_BLAS_ATTRIBS(Expr, ...) CHECK_PARAMETER(Expr, "Copy BLAS attribs are invalid: ", __VA_ARGS__)

    CHECK_COPY_BLAS_ATTRIBS(Attribs.pSrc != nullptr, "pSrc must not be null.");
    CHECK_COPY_BLAS_ATTRIBS(Attribs.pDst != nullptr, "pDst must not be null.");

    if (Attribs.Mode == COPY_AS_MODE_CLONE)
    {
        if (pDevice->GetDeviceInfo().Type == RENDER_DEVICE_TYPE_VULKAN)
        {
            const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
            const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.TriangleCount == DstDesc.TriangleCount,
                                    "Src BLAS triangle count (", SrcDesc.TriangleCount, ") must be equal to the dst BLAS triangle count (", DstDesc.TriangleCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.BoxCount == DstDesc.BoxCount,
                                    "Src BLAS box count (", SrcDesc.BoxCount, ") must be equal to the dst BLAS box count (", DstDesc.BoxCount, ").");

            CHECK_COPY_BLAS_ATTRIBS(SrcDesc.Flags == DstDesc.Flags,
                                    "Source and destination BLASes must have been created with the same flags.");

            for (Uint32 i = 0; i < SrcDesc.TriangleCount; ++i)
            {
                const BLASTriangleDesc& SrcTri = SrcDesc.pTriangles[i];
                const Uint32            Index  = Attribs.pDst->GetGeometryDescIndex(SrcTri.GeometryName);
                CHECK_COPY_BLAS_ATTRIBS(Index != INVALID_INDEX,
                                        "Src GeometryName ('", SrcTri.GeometryName, "') at index ", i, " is not found in pDst.");
                const BLASTriangleDesc& DstTri = DstDesc.pTriangles[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxVertexCount == DstTri.MaxVertexCount,
                                        "MaxVertexCount value (", SrcTri.MaxVertexCount, ") in source triangle description at index ", i,
                                        " does not match MaxVertexCount value (", DstTri.MaxVertexCount, ") in the destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexValueType == DstTri.VertexValueType,
                                        "VertexValueType value (", GetValueTypeString(SrcTri.VertexValueType), ") in source triangle description at index ", i,
                                        " does not match VertexValueType value (", GetValueTypeString(DstTri.VertexValueType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.VertexComponentCount == DstTri.VertexComponentCount,
                                        "VertexComponentCount value (", Uint32{SrcTri.VertexComponentCount}, ") in source triangle description at index ", i,
                                        " does not match VertexComponentCount value (", Uint32{DstTri.VertexComponentCount}, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.MaxPrimitiveCount == DstTri.MaxPrimitiveCount,
                                        "MaxPrimitiveCount value (", SrcTri.MaxPrimitiveCount, ") in source triangle description at index ", i,
                                        " does not match MaxPrimitiveCount value (", DstTri.MaxPrimitiveCount, ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.IndexType == DstTri.IndexType,
                                        "IndexType value (", GetValueTypeString(SrcTri.IndexType), ") in source triangle description at index ", i,
                                        " does not match IndexType value (", GetValueTypeString(DstTri.IndexType), ") in destination description.");
                CHECK_COPY_BLAS_ATTRIBS(SrcTri.AllowsTransforms == DstTri.AllowsTransforms,
                                        "AllowsTransforms value (", (SrcTri.AllowsTransforms ? "true" : "false"), ") in source triangle description at index ", i,
                                        " does not match AllowsTransforms value (", (DstTri.AllowsTransforms ? "true" : "false"), ") in destination description.");
            }

            for (Uint32 i = 0; i < SrcDesc.BoxCount; ++i)
            {
                const BLASBoundingBoxDesc& SrcBox = SrcDesc.pBoxes[i];
                const Uint32               Index  = Attribs.pDst->GetGeometryDescIndex(SrcBox.GeometryName);
                if (Index == INVALID_INDEX)
                {
                    LOG_ERROR_MESSAGE("Copy BLAS attribs are invalid: pSrc->GetDesc().pBoxes[", i, "].GeometryName ('", SrcBox.GeometryName, "') is not found in pDst.");
                    return false;
                }
                const BLASBoundingBoxDesc& DstBox = DstDesc.pBoxes[Index];

                CHECK_COPY_BLAS_ATTRIBS(SrcBox.MaxBoxCount == DstBox.MaxBoxCount,
                                        "MaxBoxCount value (", SrcBox.MaxBoxCount, ") in source box description at index ", i,
                                        " does not match MaxBoxCount value (", DstBox.MaxBoxCount, ") in destination description.");
            }
        }
    }
    else if (Attribs.Mode == COPY_AS_MODE_COMPACT)
    {
        const BottomLevelASDesc& SrcDesc = Attribs.pSrc->GetDesc();
        const BottomLevelASDesc& DstDesc = Attribs.pDst->GetDesc();

        CHECK_COPY_BLAS_ATTRIBS((SrcDesc.Flags & RAYTRACING_BUILD_AS_ALLOW_COMPACTION) == RAYTRACING_BUILD_AS_ALLOW_COMPACTION, "must be have been create with RAYTRACING_BUILD_AS_ALLOW_COMPACTION flag.");
        CHECK_COPY_BLAS_ATTRIBS(DstDesc.CompactedSize != 0, "pDst must have been create with non-zero CompactedSize.");
    }
    else
    {
        LOG_ERROR_MESSAGE("IDeviceContext::CopyBLAS: unknown Mode.");
        return false;
    }

#undef CHECK_COPY_BLAS_ATTRIBS

    return true;
}